

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O1

int http_CloseHttpConnection(void *Handle)

{
  http_connection_handle_t *handle;
  
  if (Handle != (void *)0x0) {
    sock_destroy((SOCKINFO *)Handle,2);
    httpmsg_destroy((http_message_t *)((long)Handle + 0x90));
    free(Handle);
    return 0;
  }
  return -0x65;
}

Assistant:

int http_CloseHttpConnection(void *Handle)
{
	http_connection_handle_t *handle = Handle;
	if (!handle)
		return UPNP_E_INVALID_PARAM;
	/*should shutdown completely */
	sock_destroy(&handle->sock_info, SD_BOTH);
	httpmsg_destroy(&handle->response.msg);
	free(handle);
	return UPNP_E_SUCCESS;
}